

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

ER __thiscall
slang::ast::ExpressionStatement::evalImpl(ExpressionStatement *this,EvalContext *context)

{
  CallExpression *this_00;
  SubroutineKind SVar1;
  Diagnostic *this_01;
  string_view arg;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_40;
  
  this_00 = (CallExpression *)this->expr;
  if ((((this_00->super_Expression).kind == Call) &&
      (*(__index_type *)
        ((long)&(this_00->subroutine).
                super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                .
                super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                .
                super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                .
                super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                .
                super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                .
                super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
        + 0x30) == '\x01')) && (SVar1 = CallExpression::getSubroutineKind(this_00), SVar1 == Task))
  {
    this_01 = EvalContext::addDiag(context,(DiagCode)0x26000c,this->expr->sourceRange);
    if ((((CallExpression *)this->expr)->super_Expression).kind == Call) {
      arg = CallExpression::getSubroutineName((CallExpression *)this->expr);
      Diagnostic::operator<<(this_01,arg);
      return Success;
    }
    assert::assertFailed
              ("T::isKind(kind)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Expression.h"
               ,299,"const T &slang::ast::Expression::as() const [T = slang::ast::CallExpression]");
  }
  Expression::eval((ConstantValue *)&local_40,this->expr,context);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_40);
  return (uint)(local_40._M_index != '\0');
}

Assistant:

ER ExpressionStatement::evalImpl(EvalContext& context) const {
    // Skip system task invocations.
    if (expr.kind == ExpressionKind::Call && expr.as<CallExpression>().isSystemCall() &&
        expr.as<CallExpression>().getSubroutineKind() == SubroutineKind::Task) {
        context.addDiag(diag::ConstSysTaskIgnored, expr.sourceRange)
            << expr.as<CallExpression>().getSubroutineName();
        return ER::Success;
    }

    return expr.eval(context) ? ER::Success : ER::Fail;
}